

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall crnlib::mipmapped_texture::discard_mips(mipmapped_texture *this)

{
  uint uVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  mip_level **ppmVar3;
  uint local_18;
  uint local_14;
  uint l;
  uint f;
  mipmapped_texture *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&this->m_faces);
    if (uVar1 <= local_14) break;
    pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_14);
    uVar1 = vector<crnlib::mip_level_*>::size(pvVar2);
    if (1 < uVar1) {
      local_18 = 1;
      while( true ) {
        pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_14);
        uVar1 = vector<crnlib::mip_level_*>::size(pvVar2);
        if (uVar1 <= local_18) break;
        pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_14);
        ppmVar3 = vector<crnlib::mip_level_*>::operator[](pvVar2,local_18);
        crnlib_delete<crnlib::mip_level>(*ppmVar3);
        local_18 = local_18 + 1;
      }
      pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_14);
      vector<crnlib::mip_level_*>::resize(pvVar2,1,false);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void mipmapped_texture::discard_mips() {
  for (uint f = 0; f < m_faces.size(); f++) {
    if (m_faces[f].size() > 1) {
      for (uint l = 1; l < m_faces[f].size(); l++)
        crnlib_delete(m_faces[f][l]);

      m_faces[f].resize(1);
    }
  }

  CRNLIB_ASSERT(check());
}